

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

uint32_t get_error_values(int inc,int top,char **file,int *line,char **data,int *flags)

{
  err_error_st *peVar1;
  uint uVar2;
  uint uVar3;
  ERR_STATE *pEVar4;
  uint32_t uVar5;
  
  pEVar4 = err_get_state();
  uVar5 = 0;
  if (pEVar4 != (ERR_STATE *)0x0) {
    uVar2 = pEVar4->top;
    uVar5 = 0;
    if (pEVar4->bottom != uVar2) {
      if (top == 0) {
        uVar2 = pEVar4->bottom + 1 & 0xf;
      }
      else if (inc != 0) {
        __assert_fail("!inc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                      ,0x9c,
                      "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)"
                     );
      }
      peVar1 = pEVar4->errors + uVar2;
      uVar5 = pEVar4->errors[uVar2].packed;
      if (line != (int *)0x0 && file != (char **)0x0) {
        if (peVar1->file == (char *)0x0) {
          *file = "NA";
          uVar3 = 0;
        }
        else {
          *file = peVar1->file;
          uVar3 = (uint)peVar1->line;
        }
        *line = uVar3;
      }
      if (data != (char **)0x0) {
        if (peVar1->data == (char *)0x0) {
          *data = "";
          if (flags != (int *)0x0) {
            *flags = 0;
          }
        }
        else {
          *data = peVar1->data;
          if (flags != (int *)0x0) {
            *flags = 3;
          }
          if (inc == 0) {
            return uVar5;
          }
          if (peVar1->data != (char *)0x0) {
            free(pEVar4->to_free);
            pEVar4->to_free = peVar1->data;
          }
          peVar1->data = (char *)0x0;
        }
      }
      if (inc != 0) {
        if (top != 0) {
          __assert_fail("!top",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                        ,0xce,
                        "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)"
                       );
        }
        free(peVar1->data);
        peVar1->file = (char *)0x0;
        peVar1->data = (char *)0x0;
        peVar1->packed = 0;
        peVar1->line = 0;
        *(undefined2 *)&peVar1->field_0x16 = 0;
        pEVar4->bottom = uVar2;
      }
    }
  }
  return uVar5;
}

Assistant:

static uint32_t get_error_values(int inc, int top, const char **file, int *line,
                                 const char **data, int *flags) {
  unsigned i = 0;
  ERR_STATE *state;
  struct err_error_st *error;
  uint32_t ret;

  state = err_get_state();
  if (state == NULL || state->bottom == state->top) {
    return 0;
  }

  if (top) {
    assert(!inc);
    // last error
    i = state->top;
  } else {
    i = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[i];
  ret = error->packed;

  if (file != NULL && line != NULL) {
    if (error->file == NULL) {
      *file = "NA";
      *line = 0;
    } else {
      *file = error->file;
      *line = error->line;
    }
  }

  if (data != NULL) {
    if (error->data == NULL) {
      *data = "";
      if (flags != NULL) {
        *flags = 0;
      }
    } else {
      *data = error->data;
      if (flags != NULL) {
        // Without |ERR_FLAG_MALLOCED|, rust-openssl assumes the string has a
        // static lifetime. In both cases, we retain ownership of the string,
        // and the caller is not expected to free it.
        *flags = ERR_FLAG_STRING | ERR_FLAG_MALLOCED;
      }
      // If this error is being removed, take ownership of data from
      // the error. The semantics are such that the caller doesn't
      // take ownership either. Instead the error system takes
      // ownership and retains it until the next call that affects the
      // error queue.
      if (inc) {
        if (error->data != NULL) {
          free(state->to_free);
          state->to_free = error->data;
        }
        error->data = NULL;
      }
    }
  }

  if (inc) {
    assert(!top);
    err_clear(error);
    state->bottom = i;
  }

  return ret;
}